

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall qclab::qgates::CX<double>::CX(CX<double> *this)

{
  CX<double> *this_local;
  
  QControlledGate2<double>::QControlledGate2(&this->super_QControlledGate2<double>,0,1);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00150d00;
  std::make_unique<qclab::qgates::PauliX<double>,int>((int *)&this->gate_);
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }